

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

bool __thiscall
Tokenizer::tokenize_symbol(Tokenizer *this,char character,string *token,string *meta_string)

{
  bool bVar1;
  ulong uVar2;
  value_type *__x;
  string local_88 [32];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  streampos cur_pos;
  char local_31;
  char next_char;
  string *meta_string_local;
  string *token_local;
  char character_local;
  Tokenizer *this_local;
  
  _local_48 = save_file_position(this);
  std::istream::get((char *)this->file_stream);
  if (((character == '/') && (local_31 == '/')) || ((character == '/' && (local_31 == '*')))) {
    local_58 = _local_48;
    std::istream::seekg(this->file_stream,local_48,_cur_pos);
  }
  else {
    local_68 = _local_48;
    std::istream::seekg(this->file_stream,local_48,_cur_pos);
    bVar1 = is_multiline_comment(character,token);
    if (!bVar1) {
      bVar1 = is_string(character,meta_string,token);
      if (!bVar1) {
        bVar1 = is_singleline_comment(character,token);
        if (!bVar1) {
          uVar2 = std::__cxx11::string::empty();
          if ((uVar2 & 1) == 0) {
            std::
            queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::push(&this->token_queue,token);
            std::__cxx11::string::operator=((string *)token,"");
          }
          std::__cxx11::string::string(local_88);
          __x = (value_type *)std::__cxx11::string::operator+=(local_88,character);
          std::
          queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push(&this->token_queue,__x);
          std::__cxx11::string::~string(local_88);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Tokenizer::tokenize_symbol(char character, std::string& token, const std::string& meta_string) {
    char next_char;
    std::streampos cur_pos = save_file_position();
    file_stream.get(next_char);

    if (character == '/' && next_char == '/' || character == '/' && next_char == '*') {
        file_stream.seekg(cur_pos);
        return false;
    }
    file_stream.seekg(cur_pos);

    if (!is_multiline_comment(character, token) &&
            !is_string(character, meta_string, token) && !is_singleline_comment(character, token))  {

        if (!token.empty()){
            token_queue.push(token);
            token = "";
        }
        token_queue.push(std::string() += character);
        return true;
    }
    return false;
}